

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::torrent
          (torrent *this,session_interface *ses,bool session_paused,add_torrent_params *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  void *pvVar6;
  error_code ec_00;
  bool bVar7;
  bool bVar8;
  int iVar9;
  time_point32 tVar10;
  undefined4 extraout_var;
  io_context *context;
  undefined4 extraout_var_01;
  session_settings *psVar11;
  element_type *peVar12;
  system_error *this_00;
  file_storage *this_01;
  int64_t iVar13;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *this_02;
  reference __args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  reference pvVar15;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_> *aes;
  reference piVar16;
  ulong uVar17;
  info_hash_t *this_03;
  char *pcVar18;
  stat *__buf;
  error_code eVar19;
  string_view sVar20;
  const_iterator cVar21;
  const_iterator __last;
  const_iterator __first;
  bool local_6eb;
  time_t local_5d0;
  undefined1 local_4f0 [32];
  container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
  local_4d0;
  container_wrapper<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  local_4b8;
  duration<long,_std::ratio<1L,_1L>_> local_4a0;
  rep_conflict local_494;
  duration<long,_std::ratio<1L,_1L>_> local_490;
  rep_conflict local_484;
  duration<long,_std::ratio<1L,_1L>_> local_480;
  duration<int,std::ratio<1l,1l>> local_474 [4];
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *local_470;
  __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  local_468;
  undefined1 local_460 [32];
  uint32_t local_440;
  pointer local_438;
  uint32_t local_430;
  bool local_421;
  pointer local_420;
  uint32_t local_418;
  pointer local_410;
  uint32_t local_408;
  uint32_t *local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_3f8;
  uint32_t local_3e8;
  const_iterator local_3e0;
  __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  local_3d0;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *local_3c8;
  __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  local_3c0;
  __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  local_3b8;
  __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  local_3b0;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *local_3a8;
  __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  local_3a0;
  __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  local_398;
  undefined8 local_390;
  unsigned_long local_388;
  unsigned_long local_380;
  int local_374;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_370;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_368;
  string_view local_360;
  undefined1 local_350 [8];
  announce_entry e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  iterator tier_iter;
  int tier;
  pointer local_2a0;
  reference local_298;
  web_seed_t *w;
  iterator __end2_1;
  iterator __begin2_1;
  vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *__range2_1;
  pointer ppStack_270;
  pointer local_268;
  string local_260;
  reference local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool multi_file;
  web_seed_entry *e;
  const_iterator __end3;
  const_iterator __begin3;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *__range3;
  unsigned_long local_1e8;
  undefined1 local_1e0 [8];
  vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> ws;
  undefined1 auStack_1b8 [8];
  error_code ec;
  unsigned_long local_180 [3];
  unsigned_long local_168 [3];
  unsigned_long local_150 [3];
  unsigned_long local_138 [3];
  unsigned_long local_120;
  int local_114 [3];
  unsigned_long local_108;
  unsigned_long local_100 [3];
  unsigned_long local_e8 [3];
  unsigned_long local_d0 [3];
  unsigned_long local_b8 [3];
  unsigned_long local_a0 [3];
  unsigned_long local_88;
  int local_80 [4];
  unsigned_long local_70;
  unsigned_long local_68 [3];
  unsigned_long local_50;
  undefined1 local_48 [16];
  add_torrent_params *local_28;
  add_torrent_params *p_local;
  session_interface *psStack_18;
  bool session_paused_local;
  session_interface *ses_local;
  torrent *this_local;
  undefined4 extraout_var_00;
  
  pcVar18 = (char *)(ulong)(session_paused & 1);
  local_28 = p;
  p_local._7_1_ = session_paused;
  psStack_18 = ses;
  ses_local = (session_interface *)this;
  torrent_hot_members::torrent_hot_members
            (&this->super_torrent_hot_members,ses,p,SUB41(session_paused & 1,0));
  request_callback::request_callback(&this->super_request_callback);
  peer_class_set::peer_class_set(&this->super_peer_class_set);
  ::std::enable_shared_from_this<libtorrent::aux::torrent>::enable_shared_from_this
            (&this->super_enable_shared_from_this<libtorrent::aux::torrent>);
  (this->super_request_callback)._vptr_request_callback = (_func_int **)&PTR__torrent_00b939a0;
  ::std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_dht_start_time);
  ::std::shared_ptr<const_libtorrent::ip_filter>::shared_ptr(&this->m_ip_filter);
  this->m_total_uploaded = local_28->total_uploaded;
  this->m_total_downloaded = local_28->total_downloaded;
  this->m_padding_bytes = 0;
  storage_holder::storage_holder(&this->m_storage);
  ::std::unique_ptr<boost::asio::ssl::context,std::default_delete<boost::asio::ssl::context>>::
  unique_ptr<std::default_delete<boost::asio::ssl::context>,void>
            ((unique_ptr<boost::asio::ssl::context,std::default_delete<boost::asio::ssl::context>> *
             )&this->m_ssl_ctx);
  ::std::__cxx11::list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
  list(&this->m_web_seeds);
  ::std::__cxx11::
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  ::list(&this->m_extensions);
  iVar9 = (*(psStack_18->super_session_logger)._vptr_session_logger[7])();
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>
            (&this->m_tracker_timer,(io_context *)CONCAT44(extraout_var,iVar9),(type *)0x0);
  iVar9 = (*(psStack_18->super_session_logger)._vptr_session_logger[7])();
  context = (io_context *)CONCAT44(extraout_var_00,iVar9);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>(&this->m_inactivity_timer,context,(type *)0x0);
  stat::stat(&this->m_stat,(char *)context,__buf);
  container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  ::container_wrapper(&this->m_file_priority);
  ::std::
  map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  ::map(&this->m_deferred_file_priorities);
  aux::file_progress::file_progress(&this->m_file_progress);
  suggest_piece::suggest_piece(&this->m_suggest_pieces);
  tracker_list::tracker_list(&this->m_trackers);
  ::std::
  vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  ::vector(&this->m_time_critical_pieces);
  ::std::__cxx11::string::string((string *)&this->m_trackerid,(string *)&local_28->trackerid);
  local_48 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&local_28->save_path);
  sVar20._M_len = local_48._8_8_;
  sVar20._M_str = pcVar18;
  complete_abi_cxx11_(&this->m_save_path,local_48._0_8_,sVar20);
  ::std::
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ::vector(&this->m_predictive_pieces);
  container_wrapper<libtorrent::aux::merkle_tree,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
  ::container_wrapper(&this->m_merkle_trees);
  iVar9 = (*(psStack_18->super_session_logger)._vptr_session_logger[0x4b])();
  this->m_stats_counters = (counters *)CONCAT44(extraout_var_01,iVar9);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  typed_bitfield(&this->m_verified);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  typed_bitfield(&this->m_verifying);
  boost::system::error_code::error_code(&this->m_error);
  ::std::
  unique_ptr<libtorrent::add_torrent_params,std::default_delete<libtorrent::add_torrent_params>>::
  unique_ptr<std::default_delete<libtorrent::add_torrent_params>,void>
            ((unique_ptr<libtorrent::add_torrent_params,std::default_delete<libtorrent::add_torrent_params>>
              *)&this->m_add_torrent_params);
  ::std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)
             &this->m_name);
  if (local_28->added_time == 0) {
    local_5d0 = time((time_t *)0x0);
  }
  else {
    local_5d0 = local_28->added_time;
  }
  this->m_added_time = local_5d0;
  this->m_completed_time = local_28->completed_time;
  this->m_last_seen_complete = local_28->last_seen_complete;
  this->m_swarm_last_seen_complete = local_28->last_seen_complete;
  (this->m_info_hash).v2.m_number._M_elems[7] = (local_28->info_hashes).v2.m_number._M_elems[7];
  uVar1 = *(undefined8 *)(local_28->info_hashes).v1.m_number._M_elems;
  uVar2 = *(undefined8 *)((local_28->info_hashes).v1.m_number._M_elems + 2);
  uVar3 = *(undefined8 *)((local_28->info_hashes).v1.m_number._M_elems + 4);
  uVar4 = *(undefined8 *)((local_28->info_hashes).v2.m_number._M_elems + 1);
  uVar5 = *(undefined8 *)((local_28->info_hashes).v2.m_number._M_elems + 5);
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) =
       *(undefined8 *)((local_28->info_hashes).v2.m_number._M_elems + 3);
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) = uVar5;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = uVar3;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1) = uVar4;
  *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems = uVar1;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = uVar2;
  container_wrapper<libtorrent::aux::link,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::link,_8UL>_>
  ::container_wrapper(&this->m_links);
  this->m_num_verified = 0;
  tVar10 = time_now32();
  (this->m_started).__d.__r = (rep_conflict)tVar10.__d.__r;
  tVar10 = time_now32();
  (this->m_became_seed).__d.__r = (rep_conflict)tVar10.__d.__r;
  tVar10 = time_now32();
  (this->m_became_finished).__d.__r = (rep_conflict)tVar10.__d.__r;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
            (&this->m_checking_piece,0);
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
            (&this->m_num_checked_pieces,0);
  (this->m_error_file).m_val = -1;
  this->m_average_piece_time = 0;
  this->m_piece_time_deviation = 0;
  this->m_total_failed_bytes = 0;
  this->m_total_redundant_bytes = 0;
  strong_typedef<int,_libtorrent::queue_position_tag,_void>::strong_typedef
            (&this->m_sequence_number,-1);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::vector(&this->m_peers_to_disconnect);
  deferred_handler::deferred_handler(&this->m_deferred_disconnect);
  ::std::
  set<libtorrent::digest32<160L>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<libtorrent::digest32<160L>_>_>
  ::set(&this->m_outgoing_pids);
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::strong_typedef
            (&this->m_peer_class,0);
  this->m_num_connecting = 0;
  psVar11 = settings(this);
  generate_peer_id(&this->m_peer_id,psVar11);
  tVar10 = time_now32();
  (this->m_upload_mode_time).__d.__r = (rep_conflict)tVar10.__d.__r;
  local_68[2] = (local_28->flags).m_val;
  local_68[1] = 0x10;
  local_50 = (unsigned_long)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                        local_68[2],
                        (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x10);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_50);
  this->field_0x5c0 = this->field_0x5c0 & 0xfe | !bVar7;
  local_70 = (local_28->flags).m_val;
  local_80[2] = 0x10;
  local_80[3] = 0;
  local_68[0] = (unsigned_long)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                           local_70,(bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                     )0x10);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_68);
  this->field_0x5c0 = this->field_0x5c0 & 0xfd | !bVar7 * '\x02';
  this->field_0x5c0 = this->field_0x5c0 & 0xfb;
  this->field_0x5c0 = this->field_0x5c0 & 0xf7;
  this->field_0x5c0 = this->field_0x5c0 & 0xcf | ((char)local_28->storage_mode & 3) << 4;
  this->field_0x5c0 = this->field_0x5c0 & 0xbf;
  this->field_0x5c0 = this->field_0x5c0 & 0x7f;
  this->m_waiting_tracker = '\0';
  local_80[1] = 0;
  ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
            ((duration<int,std::ratio<1l,1l>> *)&this->m_active_time,local_80 + 1);
  local_80[0] = 0;
  ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
            ((duration<int,std::ratio<1l,1l>> *)&this->m_finished_time,local_80);
  local_a0[2] = (local_28->flags).m_val;
  local_a0[1] = 0x200;
  local_88 = (unsigned_long)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                        local_a0[2],
                        (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x200);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_88);
  this->field_0x5cc = this->field_0x5cc & 0xfe | bVar7;
  this->field_0x5cc = this->field_0x5cc & 0xfd;
  this->field_0x5cc = this->field_0x5cc & 0xfb;
  local_b8[2] = (local_28->flags).m_val;
  local_b8[1] = 0x100;
  local_a0[0] = (unsigned_long)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                           local_b8[2],
                           (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x100)
  ;
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_a0);
  this->field_0x5cc = this->field_0x5cc & 0xf7 | bVar7 << 3;
  local_d0[2] = (local_28->flags).m_val;
  local_d0[1] = 0x400;
  local_b8[0] = (unsigned_long)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                           local_d0[2],
                           (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x400)
  ;
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_b8);
  this->field_0x5cc = this->field_0x5cc & 0xef | bVar7 << 4;
  local_e8[2] = (local_28->flags).m_val;
  local_e8[1] = 0x80000;
  local_d0[0] = (unsigned_long)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                           local_e8[2],
                           (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                           0x80000);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_d0);
  this->field_0x5cc = this->field_0x5cc & 0xdf | !bVar7 << 5;
  local_100[2] = (local_28->flags).m_val;
  local_100[1] = 0x100000;
  local_e8[0] = (unsigned_long)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                           local_100[2],
                           (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                           0x100000);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_e8);
  this->field_0x5cc = this->field_0x5cc & 0xbf | !bVar7 << 6;
  local_108 = (local_28->flags).m_val;
  local_114[1] = 0x1000000;
  local_114[2] = 0;
  local_100[0] = (unsigned_long)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                            local_108,
                            (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                            0x1000000);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_100);
  this->field_0x5cc = this->field_0x5cc & 0x7f | bVar7 << 7;
  local_114[0] = 0;
  ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
            ((duration<int,std::ratio<1l,1l>> *)&this->m_seeding_time,local_114);
  this->field_0x5d6 = 0xff;
  *(undefined2 *)&this->field_0x5d4 = 0xffff;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>::
  bitfield_flag(&this->m_need_save_resume_data);
  *(uint *)&this->field_0x5d8 = (uint)(byte)this->field_0x5db << 0x18;
  local_138[2] = (local_28->flags).m_val;
  local_138[1] = 0x200000;
  local_120 = (unsigned_long)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                         local_138[2],
                         (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x200000
                        );
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_120);
  *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xfeffffff | (uint)!bVar7 << 0x18;
  local_150[2] = (local_28->flags).m_val;
  local_150[1] = 8;
  local_138[0] = (unsigned_long)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                            local_150[2],
                            (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x8);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_138);
  *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xfdffffff | (uint)bVar7 << 0x19;
  this->field_0x5db = this->field_0x5db & 0xfb;
  this->field_0x5db = this->field_0x5db & 0xf7;
  psVar11 = settings(this);
  iVar9 = session_settings::get_int(psVar11,0x4062);
  this->m_connect_boost_counter = (uint8_t)iVar9;
  *(uint *)&this->field_0x5dd = *(uint *)&this->field_0x5dd | 0xffffff;
  local_168[2] = (local_28->flags).m_val;
  local_168[1] = 0x10;
  local_150[0] = (unsigned_long)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                            local_168[2],
                            (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x10)
  ;
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_150);
  *(uint *)&this->field_0x5dd = *(uint *)&this->field_0x5dd & 0xfeffffff | (uint)!bVar7 << 0x18;
  this->field_0x5e0 = this->field_0x5e0 & 0xfd;
  this->field_0x5e0 = this->field_0x5e0 & 0xfb;
  tVar10 = from_time_t(local_28->last_download);
  (this->m_last_download).__d.__r = (rep_conflict)tVar10.__d.__r;
  this->m_num_seeds = 0;
  this->m_num_connecting_seeds = 0;
  tVar10 = from_time_t(local_28->last_upload);
  (this->m_last_upload).__d.__r = (rep_conflict)tVar10.__d.__r;
  pvVar6 = (local_28->userdata).m_client_ptr;
  (this->m_userdata).m_type_ptr = (local_28->userdata).m_type_ptr;
  (this->m_userdata).m_client_ptr = pvVar6;
  local_180[2] = (local_28->flags).m_val;
  local_180[1] = 0x20;
  local_168[0] = (unsigned_long)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                            local_180[2],
                            (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x20)
  ;
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_168);
  *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0xfffffffe | (uint)bVar7;
  this->field_0x600 = this->field_0x600 | 0x1e;
  this->field_0x600 = this->field_0x600 & 0xdf;
  this->field_0x600 = this->field_0x600 & 0xbf;
  *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 | 0x7fffff80;
  this->field_0x606 = this->field_0x606 & 0xf0;
  *(undefined2 *)&this->field_0x604 = 0;
  this->field_0x606 = this->field_0x606 & 0xef;
  this->field_0x606 = this->field_0x606 & 0xdf;
  this->field_0x606 = this->field_0x606 & 0xbf;
  local_180[0] = (unsigned_long)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                            (local_28->flags).m_val,
                            (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                            0x2000);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_180);
  if (bVar7) {
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>::
    operator|=(&this->m_need_save_resume_data,
               (bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)0x80);
  }
  if ((*(uint *)&this->field_0x5d8 >> 0x19 & 1) == 0) {
    inc_stats_counter(this,0xdb,1);
  }
  bVar7 = ::std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)&(this->super_torrent_hot_members).m_torrent_file);
  if (!bVar7) {
    bVar7 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28->ti);
    if (bVar7) {
      ::std::shared_ptr<libtorrent::torrent_info>::shared_ptr
                ((shared_ptr<libtorrent::torrent_info> *)&ec.cat_,&local_28->ti);
    }
    else {
      ::std::make_shared<libtorrent::torrent_info,libtorrent::info_hash_t&>((info_hash_t *)&ec.cat_)
      ;
    }
    ::std::shared_ptr<libtorrent::torrent_info>::operator=
              (&(this->super_torrent_hot_members).m_torrent_file,
               (shared_ptr<libtorrent::torrent_info> *)&ec.cat_);
    ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr
              ((shared_ptr<libtorrent::torrent_info> *)&ec.cat_);
  }
  peVar12 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  bVar7 = torrent_info::is_i2p(peVar12);
  if (bVar7) {
    this->field_0x5cc = this->field_0x5cc & 0x7f | 0x80;
  }
  peVar12 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  bVar7 = torrent_info::is_valid(peVar12);
  if (bVar7) {
    eVar19 = initialize_merkle_trees(this);
    ec._0_8_ = eVar19.cat_;
    auStack_1b8 = eVar19._0_8_;
    bVar7 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_1b8);
    if (bVar7) {
      this_00 = (system_error *)__cxa_allocate_exception(0x40);
      ws.
      super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_1b8;
      ec_00.cat_ = (error_category *)ec._0_8_;
      ec_00.val_ = auStack_1b8._0_4_;
      ec_00.failed_ = (bool)auStack_1b8[4];
      ec_00._5_3_ = auStack_1b8._5_3_;
      boost::system::system_error::system_error(this_00,ec_00);
      __cxa_throw(this_00,&boost::system::system_error::typeinfo,
                  boost::system::system_error::~system_error);
    }
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    this_01 = torrent_info::files(peVar12);
    iVar13 = file_storage::size_on_disk(this_01);
    (this->super_torrent_hot_members).m_size_on_disk = iVar13;
  }
  ::std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::vector
            ((vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *)
             local_1e0);
  local_1e8 = (unsigned_long)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                         (local_28->flags).m_val,
                         (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x1000);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_1e8);
  if (((bVar7 ^ 0xffU) & 1) != 0) {
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    this_02 = torrent_info::internal_web_seeds(peVar12);
    __end3 = ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
             ::begin(this_02);
    e = (web_seed_entry *)
        ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::end
                  (this_02);
    while( true ) {
      bVar7 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
                                  *)&e);
      if (!bVar7) break;
      __args = __gnu_cxx::
               __normal_iterator<const_libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
               ::operator*(&__end3);
      ::std::vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>::
      emplace_back<libtorrent::web_seed_entry_const&>
                ((vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>> *)
                 local_1e0,__args);
      __gnu_cxx::
      __normal_iterator<const_libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
      ::operator++(&__end3);
    }
  }
  peVar12 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  bVar8 = torrent_info::is_valid(peVar12);
  bVar7 = false;
  if (bVar8) {
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    iVar9 = torrent_info::num_files(peVar12);
    bVar7 = 1 < iVar9;
  }
  pvVar14 = &local_28->url_seeds;
  __end2 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar14);
  u = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(pvVar14);
  while( true ) {
    bVar8 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&u);
    if (!bVar8) break;
    local_240 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
    ::std::vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>> *)
               local_1e0,local_240);
    if (bVar7) {
      pvVar15 = ::std::
                vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
                back((vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                      *)local_1e0);
      ensure_trailing_slash((string *)pvVar15);
    }
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    bVar8 = torrent_info::is_valid(peVar12);
    if (!bVar8) {
      peVar12 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      pvVar15 = ::std::
                vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
                back((vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                      *)local_1e0);
      ::std::__cxx11::string::string((string *)&local_260);
      __range2_1 = (vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                    *)0x0;
      ppStack_270 = (pointer)0x0;
      local_268 = (pointer)0x0;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__range2_1);
      torrent_info::add_url_seed
                (peVar12,(string *)pvVar15,&local_260,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__range2_1);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range2_1);
      ::std::__cxx11::string::~string((string *)&local_260);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  random_shuffle<std::vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>>
            ((vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *)
             local_1e0);
  __end2_1 = ::std::
             vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
             begin((vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                    *)local_1e0);
  w = (web_seed_t *)
      ::std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::end
                ((vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                  *)local_1e0);
  while( true ) {
    bVar7 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<libtorrent::aux::web_seed_t_*,_std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>_>
                        *)&w);
    if (!bVar7) break;
    local_298 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::web_seed_t_*,_std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>_>
                ::operator*(&__end2_1);
    ::std::__cxx11::list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
    ::emplace_back<libtorrent::aux::web_seed_t>(&this->m_web_seeds,local_298);
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::web_seed_t_*,_std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>_>
    ::operator++(&__end2_1);
  }
  local_2a0 = (pointer)libtorrent::flags::operator&
                                 ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                  )(local_28->flags).m_val,
                                  (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>
                                  )0x800);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_2a0);
  if (((bVar7 ^ 0xffU) & 1) != 0) {
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    aes = torrent_info::internal_trackers(peVar12);
    tracker_list::replace(&this->m_trackers,aes);
  }
  tier_iter._M_current._4_4_ = 0;
  __range2_2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)::std::vector<int,_std::allocator<int>_>::begin(&local_28->tracker_tiers);
  pvVar14 = &local_28->trackers;
  __end2_2 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar14);
  url = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar14);
  while( true ) {
    bVar7 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&url);
    if (!bVar7) break;
    e_1._104_8_ = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_2);
    uVar17 = ::std::__cxx11::string::empty();
    if ((uVar17 & 1) == 0) {
      sVar20 = (string_view)
               ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)e_1._104_8_);
      local_360 = sVar20;
      announce_entry::announce_entry((announce_entry *)local_350,sVar20);
      local_368._M_current =
           (int *)::std::vector<int,_std::allocator<int>_>::end(&local_28->tracker_tiers);
      bVar7 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &__range2_2,&local_368);
      if (bVar7) {
        local_370 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &__range2_2,0);
        piVar16 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&local_370);
        tier_iter._M_current._4_4_ = *piVar16;
      }
      e_1.endpoints.
      super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      e_1.endpoints.
      super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
           e_1.endpoints.
           super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 0xf0 | 4;
      e_1.endpoints.
      super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = tier_iter._M_current._4_1_;
      bVar7 = tracker_list::add_tracker(&this->m_trackers,(announce_entry *)local_350);
      if (bVar7) {
        peVar12 = ::std::
                  __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&(this->super_torrent_hot_members).m_torrent_file);
        bVar7 = torrent_info::is_valid(peVar12);
        if (!bVar7) {
          peVar12 = ::std::
                    __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&(this->super_torrent_hot_members).m_torrent_file);
          torrent_info::add_tracker
                    (peVar12,(string *)&e_1.list_hook.super_type.super_type.prev_,
                     (uint)e_1.endpoints.
                           super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_,
                     e_1.endpoints.
                     super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ &
                     (source_tex|source_magnet_link|source_client|source_torrent));
        }
        local_374 = 0;
      }
      else {
        local_374 = 9;
      }
      announce_entry::~announce_entry((announce_entry *)local_350);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_2);
  }
  psVar11 = settings(this);
  bVar7 = session_settings::get_bool(psVar11,0x8013);
  if (bVar7) {
    tracker_list::prioritize_udp_trackers(&this->m_trackers);
  }
  peVar12 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  bVar7 = torrent_info::is_valid(peVar12);
  if (bVar7) {
    local_388 = (local_28->flags).m_val;
    local_390._0_4_ = 1;
    local_390._4_4_ = 0;
    local_380 = (unsigned_long)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                           local_388,
                           (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x1);
    bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_380);
    local_6eb = false;
    if (bVar7) {
      local_3a0._M_current =
           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
           ::std::
           vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ::begin(&local_28->file_priorities);
      local_3a8 = (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                  ::std::
                  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  ::end(&local_28->file_priorities);
      local_398 = ::std::
                  find<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>
                            (local_3a0,
                             (__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                              )local_3a8,
                             (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                              *)&dont_download);
      local_3b0._M_current =
           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
           ::std::
           vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ::end(&local_28->file_priorities);
      bVar7 = __gnu_cxx::operator==(&local_398,&local_3b0);
      local_6eb = false;
      if (bVar7) {
        local_3c0._M_current =
             (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
             ::std::
             vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ::begin(&local_28->piece_priorities);
        local_3c8 = (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                    ::std::
                    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ::end(&local_28->piece_priorities);
        local_3b8 = ::std::
                    find<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>
                              (local_3c0,
                               (__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                                )local_3c8,
                               (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                *)&dont_download);
        local_3d0._M_current =
             (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
             ::std::
             vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ::end(&local_28->piece_priorities);
        bVar7 = __gnu_cxx::operator==(&local_3b8,&local_3d0);
        local_6eb = false;
        if (bVar7) {
          cVar21 = bitfield::begin(&(local_28->have_pieces).super_bitfield);
          local_400 = cVar21.buf;
          local_3f8._M_allocated_capacity._0_4_ = cVar21.bit;
          local_3f8._8_8_ = local_400;
          local_3e8 = local_3f8._M_allocated_capacity._0_4_;
          cVar21 = bitfield::end(&(local_28->have_pieces).super_bitfield);
          local_420 = (pointer)cVar21.buf;
          local_418 = cVar21.bit;
          local_421 = false;
          __first.bit = local_3e8;
          __first.buf = (uint32_t *)local_3f8._8_8_;
          __last._12_4_ = 0;
          __last.buf = (uint32_t *)SUB128(cVar21._0_12_,0);
          __last.bit = SUB124(cVar21._0_12_,8);
          __first._12_4_ = 0;
          local_410 = local_420;
          local_408 = local_418;
          cVar21 = ::std::find<libtorrent::bitfield::const_iterator,bool>(__first,__last,&local_421)
          ;
          local_438 = (pointer)cVar21.buf;
          local_430 = cVar21.bit;
          local_3e0.buf = (uint32_t *)local_438;
          local_3e0.bit = local_430;
          cVar21 = bitfield::end(&(local_28->have_pieces).super_bitfield);
          local_460._8_8_ = cVar21.buf;
          local_460._16_4_ = cVar21.bit;
          local_460._24_8_ = local_460._8_8_;
          local_440 = local_460._16_4_;
          local_6eb = bitfield::const_iterator::operator==
                                (&local_3e0,(const_iterator *)(local_460 + 0x18));
        }
      }
    }
    this->field_0x5cc = this->field_0x5cc & 0xfb | local_6eb << 2;
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xfffffffffdffffff | 0x2000000;
  }
  else {
    uVar17 = ::std::__cxx11::string::empty();
    if ((uVar17 & 1) == 0) {
      ::std::make_unique<std::__cxx11::string,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460);
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->m_name,
                  (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_460);
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_460);
    }
  }
  local_468._M_current =
       (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
       ::std::
       vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
       ::begin(&local_28->file_priorities);
  local_470 = (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
              ::std::
              vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ::end(&local_28->file_priorities);
  ::std::
  vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>
  ::
  assign<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>,void>
            ((vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>
              *)&this->m_file_priority,local_468,
             (__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
              )local_470);
  if (((byte)this->field_0x5cc >> 2 & 1) != 0) {
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    iVar9 = torrent_info::num_pieces(peVar12);
    bitfield::resize(&(this->m_verified).super_bitfield,iVar9,false);
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    iVar9 = torrent_info::num_pieces(peVar12);
    bitfield::resize(&(this->m_verifying).super_bitfield,iVar9,false);
  }
  this->m_total_uploaded = local_28->total_uploaded;
  this->m_total_downloaded = local_28->total_downloaded;
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_480,&local_28->active_time);
  ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
            (local_474,&local_480);
  (this->m_active_time).__r = (rep_conflict)local_474;
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_490,&local_28->finished_time);
  ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<int,std::ratio<1l,1l>> *)&local_484,&local_490);
  (this->m_finished_time).__r = local_484;
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_4a0,&local_28->seeding_time);
  ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<int,std::ratio<1l,1l>> *)&local_494,&local_4a0);
  (this->m_seeding_time).__r = local_494;
  if ((this->m_completed_time != 0) && (this->m_completed_time < this->m_added_time)) {
    this->m_completed_time = this->m_added_time;
  }
  peVar12 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  bVar7 = torrent_info::is_valid(peVar12);
  if (bVar7) {
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    this_03 = torrent_info::info_hashes(peVar12);
    bVar7 = info_hash_t::has_v2(this_03);
    if (bVar7) {
      bVar7 = ::std::
              vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
              ::empty(&(local_28->merkle_trees).
                       super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                     );
      if (!bVar7) {
        container_wrapper<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
        ::container_wrapper(&local_4b8,&local_28->merkle_trees);
        container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
        ::container_wrapper(&local_4d0,&local_28->merkle_tree_mask);
        container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
        ::container_wrapper((container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                             *)(local_4f0 + 8),&local_28->verified_leaf_hashes);
        load_merkle_trees(this,&local_4b8,&local_4d0,
                          (container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                           *)(local_4f0 + 8));
        container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
        ::~container_wrapper
                  ((container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                    *)(local_4f0 + 8));
        container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
        ::~container_wrapper(&local_4d0);
        container_wrapper<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
        ::~container_wrapper(&local_4b8);
      }
    }
  }
  bVar7 = valid_metadata(this);
  if (bVar7) {
    peVar12 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    iVar9 = torrent_info::num_pieces(peVar12);
    inc_stats_counter(this,0x6e,iVar9);
  }
  ::std::make_unique<libtorrent::add_torrent_params,libtorrent::add_torrent_params>
            ((add_torrent_params *)local_4f0);
  ::std::
  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>::
  operator=(&this->m_add_torrent_params,
            (unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
             *)local_4f0);
  ::std::
  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>::
  ~unique_ptr((unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               *)local_4f0);
  ::std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::~vector
            ((vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *)
             local_1e0);
  return;
}

Assistant:

torrent::torrent(
		aux::session_interface& ses
		, bool const session_paused
		, add_torrent_params&& p)
		: torrent_hot_members(ses, p, session_paused)
		, m_total_uploaded(p.total_uploaded)
		, m_total_downloaded(p.total_downloaded)
		, m_tracker_timer(ses.get_context())
		, m_inactivity_timer(ses.get_context())
		, m_trackerid(p.trackerid)
		, m_save_path(complete(p.save_path))
		, m_stats_counters(ses.stats_counters())
		, m_added_time(p.added_time ? p.added_time : std::time(nullptr))
		, m_completed_time(p.completed_time)
		, m_last_seen_complete(p.last_seen_complete)
		, m_swarm_last_seen_complete(p.last_seen_complete)
		, m_info_hash(p.info_hashes)
		, m_error_file(torrent_status::error_file_none)
		, m_sequence_number(-1)
		, m_peer_id(aux::generate_peer_id(settings()))
		, m_announce_to_trackers(!(p.flags & torrent_flags::paused))
		, m_announce_to_lsd(!(p.flags & torrent_flags::paused))
		, m_has_incoming(false)
		, m_files_checked(false)
		, m_storage_mode(p.storage_mode)
		, m_announcing(false)
		, m_added(false)
		, m_sequential_download(p.flags & torrent_flags::sequential_download)
		, m_auto_sequential(false)
		, m_seed_mode(false)
#ifndef TORRENT_DISABLE_SUPERSEEDING
		, m_super_seeding(p.flags & torrent_flags::super_seeding)
#endif
		, m_stop_when_ready(p.flags & torrent_flags::stop_when_ready)
		, m_enable_dht(!bool(p.flags & torrent_flags::disable_dht))
		, m_enable_lsd(!bool(p.flags & torrent_flags::disable_lsd))
		, m_i2p(bool(p.flags & torrent_flags::i2p_torrent))
		, m_max_uploads((1 << 24) - 1)
		, m_num_uploads(0)
		, m_enable_pex(!bool(p.flags & torrent_flags::disable_pex))
		, m_apply_ip_filter(p.flags & torrent_flags::apply_ip_filter)
		, m_pending_active_change(false)
		, m_v2_piece_layers_validated(false)
		, m_connect_boost_counter(static_cast<std::uint8_t>(settings().get_int(settings_pack::torrent_connect_boost)))
		, m_incomplete(0xffffff)
		, m_announce_to_dht(!(p.flags & torrent_flags::paused))
		, m_ssl_torrent(false)
		, m_deleted(false)
		, m_last_download(aux::from_time_t(p.last_download))
		, m_last_upload(aux::from_time_t(p.last_upload))
		, m_userdata(p.userdata)
		, m_auto_managed(p.flags & torrent_flags::auto_managed)
		, m_current_gauge_state(static_cast<std::uint32_t>(no_gauge_state))
		, m_moving_storage(false)
		, m_inactive(false)
		, m_downloaded(0xffffff)
		, m_progress_ppm(0)
		, m_torrent_initialized(false)
		, m_outstanding_file_priority(false)
		, m_complete_sent(false)
	{
		if (p.flags & torrent_flags::need_save_resume)
		{
			m_need_save_resume_data |= torrent_handle::if_metadata_changed;
		}

		// we cannot log in the constructor, because it relies on shared_from_this
		// being initialized, which happens after the constructor returns.

#if TORRENT_USE_UNC_PATHS
		m_save_path = canonicalize_path(m_save_path);
#endif

		if (!m_apply_ip_filter)
		{
			inc_stats_counter(counters::non_filter_torrents);
		}

		if (!m_torrent_file)
			m_torrent_file = (p.ti ? p.ti : std::make_shared<torrent_info>(m_info_hash));

#if TORRENT_USE_I2P
		if (m_torrent_file->is_i2p())
			m_i2p = true;
#endif

		if (m_torrent_file->is_valid())
		{
			error_code ec = initialize_merkle_trees();
			if (ec) throw system_error(ec);
			m_size_on_disk = m_torrent_file->files().size_on_disk();
		}

		// --- WEB SEEDS ---

		// if override web seed flag is set, don't load any web seeds from the
		// torrent file.
		std::vector<web_seed_t> ws;
		if (!(p.flags & torrent_flags::deprecated_override_web_seeds))
		{
			for (auto const& e : m_torrent_file->internal_web_seeds())
				ws.emplace_back(e);
		}

		// add web seeds from add_torrent_params
		bool const multi_file = m_torrent_file->is_valid()
				&& m_torrent_file->num_files() > 1;

		for (auto const& u : p.url_seeds)
		{
			ws.emplace_back(u);

			// correct URLs to end with a "/" for multi-file torrents
			if (multi_file)
				ensure_trailing_slash(ws.back().url);
#if TORRENT_ABI_VERSION < 4
			if (!m_torrent_file->is_valid())
				m_torrent_file->add_url_seed(ws.back().url);
#endif
		}

		aux::random_shuffle(ws);
		for (auto& w : ws) m_web_seeds.emplace_back(std::move(w));

		// --- TRACKERS ---

		// if override trackers flag is set, don't load trackers from torrent file
		if (!(p.flags & torrent_flags::deprecated_override_trackers))
		{
			m_trackers.replace(m_torrent_file->internal_trackers());
		}

		int tier = 0;
		auto tier_iter = p.tracker_tiers.begin();
		for (auto const& url : p.trackers)
		{
			if (url.empty()) continue;

			aux::announce_entry e(url);
			if (tier_iter != p.tracker_tiers.end())
				tier = *tier_iter++;

			e.fail_limit = 0;
			e.source = lt::announce_entry::source_magnet_link;
			e.tier = std::uint8_t(tier);

			if (!m_trackers.add_tracker(e))
				continue;

#if TORRENT_ABI_VERSION < 4
			// add the tracker to the m_torrent_file here so that the trackers
			// will be preserved via create_torrent() when passing in just the
			// torrent_info object.
			if (!m_torrent_file->is_valid())
				m_torrent_file->add_tracker(e.url, e.tier, lt::announce_entry::tracker_source(e.source));
#endif
		}

		if (settings().get_bool(settings_pack::prefer_udp_trackers))
			m_trackers.prioritize_udp_trackers();

		if (m_torrent_file->is_valid())
		{
			// setting file- or piece priorities for seed mode makes no sense. If a
			// torrent ends up in seed mode by accident, it can be very confusing,
			// so assume the seed mode flag is not intended and don't enable it in
			// that case. Also, if the resume data says we're missing a piece, we
			// can't be in seed-mode.
			m_seed_mode = (p.flags & torrent_flags::seed_mode)
				&& std::find(p.file_priorities.begin(), p.file_priorities.end(), dont_download) == p.file_priorities.end()
				&& std::find(p.piece_priorities.begin(), p.piece_priorities.end(), dont_download) == p.piece_priorities.end()
				&& std::find(p.have_pieces.begin(), p.have_pieces.end(), false) == p.have_pieces.end();

			m_connections_initialized = true;
		}
		else
		{
			if (!p.name.empty()) m_name = std::make_unique<std::string>(p.name);
		}

		TORRENT_ASSERT(is_single_thread());
		m_file_priority.assign(p.file_priorities.begin(), p.file_priorities.end());

		if (m_seed_mode)
		{
			m_verified.resize(m_torrent_file->num_pieces(), false);
			m_verifying.resize(m_torrent_file->num_pieces(), false);
		}

		m_total_uploaded = p.total_uploaded;
		m_total_downloaded = p.total_downloaded;

		// the number of seconds this torrent has spent in started, finished and
		// seeding state so far, respectively.
		m_active_time = seconds(p.active_time);
		m_finished_time = seconds(p.finished_time);
		m_seeding_time = seconds(p.seeding_time);

		if (m_completed_time != 0 && m_completed_time < m_added_time)
			m_completed_time = m_added_time;

		// --- V2 HASHES ---

		if (m_torrent_file->is_valid() && m_torrent_file->info_hashes().has_v2())
		{
			if (!p.merkle_trees.empty())
				load_merkle_trees(
					std::move(p.merkle_trees)
					, std::move(p.merkle_tree_mask)
					, std::move(p.verified_leaf_hashes));

			// we really don't want to store extra copies of the trees
			TORRENT_ASSERT(p.merkle_trees.empty());
		}

		if (valid_metadata())
		{
			inc_stats_counter(counters::num_total_pieces_added
				, m_torrent_file->num_pieces());
		}

		// TODO: 3 we could probably get away with just saving a few fields here
		m_add_torrent_params = std::make_unique<add_torrent_params>(std::move(p));
	}